

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O0

void __thiscall
sptk::StatisticsAccumulation::StatisticsAccumulation
          (StatisticsAccumulation *this,int num_order,int num_statistics_order,bool diagonal,
          bool numerically_stable)

{
  bool numerically_stable_local;
  bool diagonal_local;
  int num_statistics_order_local;
  int num_order_local;
  StatisticsAccumulation *this_local;
  
  this->_vptr_StatisticsAccumulation = (_func_int **)&PTR__StatisticsAccumulation_0012acf8;
  this->num_order_ = num_order;
  this->num_statistics_order_ = num_statistics_order;
  this->diagonal_ = diagonal;
  this->numerically_stable_ = numerically_stable;
  this->is_valid_ = true;
  if (((this->num_order_ < 0) || (this->num_statistics_order_ < 0)) ||
     (2 < this->num_statistics_order_)) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

StatisticsAccumulation::StatisticsAccumulation(int num_order,
                                               int num_statistics_order,
                                               bool diagonal,
                                               bool numerically_stable)
    : num_order_(num_order),
      num_statistics_order_(num_statistics_order),
      diagonal_(diagonal),
      numerically_stable_(numerically_stable),
      is_valid_(true) {
  if (num_order_ < 0 || num_statistics_order_ < 0 ||
      2 < num_statistics_order_) {
    is_valid_ = false;
    return;
  }
}